

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svg2png.cpp
# Opt level: O2

int help(void)

{
  std::operator<<((ostream *)&std::cout,
                  "Usage: \n   svg2png [filename] [resolution] [bgColor]\n\nExamples: \n    $ svg2png input.svg\n    $ svg2png input.svg 512x512\n    $ svg2png input.svg 512x512 0xff00ffff\n\n"
                 );
  return 1;
}

Assistant:

int help()
{
    std::cout << "Usage: \n"
                 "   svg2png [filename] [resolution] [bgColor]\n\n"
                 "Examples: \n"
                 "    $ svg2png input.svg\n"
                 "    $ svg2png input.svg 512x512\n"
                 "    $ svg2png input.svg 512x512 0xff00ffff\n\n";
    return 1;
}